

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_websocket.c
# Opt level: O2

void test_send_chunks(void)

{
  cio_websocket *websocket;
  _Bool _Var1;
  cio_error cVar2;
  long lVar3;
  uint32_t context;
  char data [12];
  cio_write_buffer wb;
  cio_write_buffer local_80;
  long local_60;
  ws_frame local_58;
  
  lVar3 = 0;
  while( true ) {
    if (lVar3 == 8) {
      return;
    }
    local_58.direction = *(frame_direction *)((long)&DAT_00110fe8 + lVar3);
    builtin_strncpy(data,"HelloWorld!",0xc);
    local_58.frame_type = CIO_WEBSOCKET_CLOSE_FRAME;
    local_58.data = (void *)0x0;
    local_58.data_length = 0;
    local_58.last_frame = true;
    local_58.rsv = false;
    serialize_frames(&local_58,1);
    websocket = ws;
    wb.data.head.q_len = (size_t)data;
    wb.data.element.length = 6;
    local_80.data.head.q_len = 1;
    local_80.data.element.length = 6;
    *(ushort *)&(ws->ws_private).ws_flags =
         SUB42((ws->ws_private).ws_flags,0) & 0xfbff | (ushort)(lVar3 == 0) << 10;
    context = 0x1234568;
    wb.next = &local_80;
    wb.prev = &local_80;
    local_80.next = &wb;
    local_80.prev = &wb;
    local_60 = lVar3;
    cVar2 = cio_websocket_write_message_first_chunk
                      (websocket,0xc,&local_80,true,true,write_handler,&context);
    UnityAssertEqualNumber
              (0,(long)cVar2,"Writing a frame did not succeed!",0xa4c,UNITY_DISPLAY_STYLE_INT);
    wb.data.head.q_len = (size_t)(data + 6);
    wb.data.element.length = 6;
    local_80.data.head.q_len = 1;
    local_80.data.element.length = 6;
    wb.next = &local_80;
    wb.prev = &local_80;
    local_80.next = &wb;
    local_80.prev = &wb;
    cVar2 = cio_websocket_write_message_continuation_chunk(ws,&local_80,write_handler,&context);
    UnityAssertEqualNumber
              (0,(long)cVar2,"Writing a frame did not succeed!",0xa52,UNITY_DISPLAY_STYLE_INT);
    _Var1 = check_frame(CIO_WEBSOCKET_BINARY_FRAME,"HelloWorld!",0xc,true);
    if (!_Var1) break;
    cVar2 = cio_websocket_read_message(ws,read_handler,(void *)0x0);
    lVar3 = (long)cVar2;
    UnityAssertEqualNumber
              (0,lVar3,"Could not start reading a message!",0xa57,UNITY_DISPLAY_STYLE_INT);
    _Var1 = is_close_frame(1000,SUB81(lVar3,0));
    if (!_Var1) {
      UnityFail("written frame is not a close frame!",0xa58);
    }
    UnityAssertEqualNumber
              (2,(ulong)write_handler_fake.call_count,"write handler was not called!",0xa5a,
               UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              ((UNITY_INT)ws,(UNITY_INT)write_handler_fake.arg0_val,
               "websocket pointer in write handler not correct!",0xa5b,UNITY_DISPLAY_STYLE_HEX64);
    UnityAssertEqualNumber
              ((UNITY_INT)&context,(UNITY_INT)write_handler_fake.arg1_val,
               "context pointer in write handler not correct!",0xa5c,UNITY_DISPLAY_STYLE_HEX64);
    UnityAssertEqualNumber
              (0,(long)write_handler_fake.arg2_val,"error code in write handler not correct!",0xa5d,
               UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              (0,(ulong)on_error_fake.call_count,"error callback was called",0xa5f,
               UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              (1,(ulong)on_control_fake.call_count,
               "control callback was called not for last close frame",0xa60,UNITY_DISPLAY_STYLE_INT)
    ;
    free(ws);
    setUp();
    lVar3 = local_60 + 4;
  }
  UnityFail("First frame send is incorrect text frame!",0xa54);
}

Assistant:

static void test_send_chunks(void)
{
	enum frame_direction directions[] = {FROM_CLIENT, FROM_SERVER};

	for (unsigned int k = 0; k < ARRAY_SIZE(directions); k++) {
		unsigned int frame_type = CIO_WEBSOCKET_BINARY_FRAME;
		enum frame_direction direction = directions[k];
		char data[] = "HelloWorld!";
		char check_data[] = "HelloWorld!";

		struct ws_frame frames[] = {
		    {.frame_type = CIO_WEBSOCKET_CLOSE_FRAME, .direction = direction, .data = NULL, .data_length = 0, .last_frame = true, .rsv = false},
		};

		serialize_frames(frames, ARRAY_SIZE(frames));

		struct cio_write_buffer wbh;
		cio_write_buffer_head_init(&wbh);

		struct cio_write_buffer wb;
		cio_write_buffer_element_init(&wb, data, sizeof(data) / 2);
		cio_write_buffer_queue_tail(&wbh, &wb);

		ws->ws_private.ws_flags.is_server = (frames[0].direction == FROM_CLIENT) ? 1 : 0;
		uint32_t context = 0x1234568;
		enum cio_error err = cio_websocket_write_message_first_chunk(ws, sizeof(data), &wbh, true, frame_type == CIO_WEBSOCKET_BINARY_FRAME, write_handler, &context);
		TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Writing a frame did not succeed!");

		cio_write_buffer_head_init(&wbh);
		cio_write_buffer_element_init(&wb, &data[sizeof(data) / 2], sizeof(data) - (sizeof(data) / 2));
		cio_write_buffer_queue_tail(&wbh, &wb);
		err = cio_websocket_write_message_continuation_chunk(ws, &wbh, write_handler, &context);
		TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Writing a frame did not succeed!");

		TEST_ASSERT_MESSAGE(check_frame(frame_type, check_data, sizeof(check_data), true), "First frame send is incorrect text frame!");

		err = cio_websocket_read_message(ws, read_handler, NULL);
		TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Could not start reading a message!");
		TEST_ASSERT_MESSAGE(is_close_frame(CIO_WEBSOCKET_CLOSE_NORMAL, true), "written frame is not a close frame!");

		TEST_ASSERT_EQUAL_MESSAGE(2, write_handler_fake.call_count, "write handler was not called!");
		TEST_ASSERT_EQUAL_PTR_MESSAGE(ws, write_handler_fake.arg0_val, "websocket pointer in write handler not correct!");
		TEST_ASSERT_EQUAL_PTR_MESSAGE(&context, write_handler_fake.arg1_val, "context pointer in write handler not correct!");
		TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, write_handler_fake.arg2_val, "error code in write handler not correct!");

		TEST_ASSERT_EQUAL_MESSAGE(0, on_error_fake.call_count, "error callback was called");
		TEST_ASSERT_EQUAL_MESSAGE(1, on_control_fake.call_count, "control callback was called not for last close frame");

		free(ws);
		setUp();
	}
}